

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  size_type sVar5;
  ostream *poVar6;
  string local_100 [39];
  byte local_d9;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string text;
  long local_48;
  size_type pos;
  string line;
  bool inlineMarkup_local;
  string *line_in_local;
  cmRST *this_local;
  
  line.field_2._M_local_buf[0xf] = inlineMarkup;
  if ((this->OutputLinePending & 1U) != 0) {
    std::operator<<(this->OS,"\n");
    this->OutputLinePending = false;
  }
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    poVar6 = std::operator<<(this->OS,(string *)line_in);
    std::operator<<(poVar6,"\n");
  }
  else {
    ReplaceSubstitutions((string *)&pos,this,line_in);
    local_48 = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::c_str();
      bVar1 = cmsys::RegularExpression::find(&this->CMakeRole,(char *)(lVar4 + local_48));
      if (!bVar1) break;
      poVar6 = this->OS;
      cmsys::RegularExpression::start(&this->CMakeRole);
      std::__cxx11::string::substr((ulong)((long)&text.field_2 + 8),(ulong)&pos);
      std::operator<<(poVar6,(string *)(text.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(text.field_2._M_local_buf + 8));
      cmsys::RegularExpression::match_abi_cxx11_((string *)local_98,&this->CMakeRole,3);
      local_d9 = 0;
      cmsys::RegularExpression::match_abi_cxx11_(&local_b8,&this->CMakeRole,2);
      bVar2 = std::operator==(&local_b8,"command");
      bVar1 = false;
      if (bVar2) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_d8,&this->CMakeRole,5);
        local_d9 = 1;
        uVar3 = std::__cxx11::string::empty();
        bVar1 = false;
        if ((uVar3 & 1) != 0) {
          lVar4 = std::__cxx11::string::find_first_of(local_98,0xa33d36);
          bVar1 = lVar4 == -1;
        }
      }
      if ((local_d9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_d8);
      }
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_98,"()");
      }
      poVar6 = std::operator<<(this->OS,"``");
      poVar6 = std::operator<<(poVar6,(string *)local_98);
      std::operator<<(poVar6,"``");
      sVar5 = cmsys::RegularExpression::end(&this->CMakeRole);
      local_48 = sVar5 + local_48;
      std::__cxx11::string::~string((string *)local_98);
    }
    poVar6 = this->OS;
    std::__cxx11::string::substr((ulong)local_100,(ulong)&pos);
    poVar6 = std::operator<<(poVar6,local_100);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)&pos);
  }
  return;
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if (this->OutputLinePending) {
    this->OS << "\n";
    this->OutputLinePending = false;
  }
  if (inlineMarkup) {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    while (this->CMakeRole.find(line.c_str() + pos)) {
      this->OS << line.substr(pos, this->CMakeRole.start());
      std::string text = this->CMakeRole.match(3);
      // If a command reference has no explicit target and
      // no explicit "(...)" then add "()" to the text.
      if (this->CMakeRole.match(2) == "command" &&
          this->CMakeRole.match(5).empty() &&
          text.find_first_of("()") == std::string::npos) {
        text += "()";
      }
      this->OS << "``" << text << "``";
      pos += this->CMakeRole.end();
    }
    this->OS << line.substr(pos) << "\n";
  } else {
    this->OS << line_in << "\n";
  }
}